

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void * __thiscall CClient::SnapFindItem(CClient *this,int SnapID,int Type,int ID)

{
  undefined8 uVar1;
  int iVar2;
  CSnapshotItem *this_00;
  undefined4 in_ECX;
  int in_ESI;
  CSnapshot *in_RDI;
  int Index;
  int Key;
  CSnapshot *pAltSnap;
  undefined4 in_stack_ffffffffffffffe0;
  int *local_8;
  
  if (in_RDI[(long)in_ESI + 0xed09] == (CSnapshot)0x0) {
    local_8 = (int *)0x0;
  }
  else {
    uVar1 = *(undefined8 *)((long)in_RDI[(long)in_ESI + 0xed09] + 0x28);
    iVar2 = CSnapshot::GetItemIndex(in_RDI,in_ESI);
    if (iVar2 == -1) {
      local_8 = (int *)0x0;
    }
    else {
      this_00 = CSnapshot::GetItem((CSnapshot *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                                   (int)((ulong)uVar1 >> 0x20));
      local_8 = CSnapshotItem::Data(this_00);
    }
  }
  return local_8;
}

Assistant:

const void *CClient::SnapFindItem(int SnapID, int Type, int ID) const
{
	if(!m_aSnapshots[SnapID])
		return 0x0;

	CSnapshot* pAltSnap = m_aSnapshots[SnapID]->m_pAltSnap;
	int Key = (Type<<16)|(ID&0xffff);
	int Index = pAltSnap->GetItemIndex(Key);
	if(Index != -1)
		return pAltSnap->GetItem(Index)->Data();

	return 0x0;
}